

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_LdArrConstIndex<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  switch(playout->ViewType) {
  case TYPE_INT8:
    OP_LdArr<char,int>(this,playout->SlotIndex,(uint)playout->Value);
    return;
  case TYPE_UINT8:
    OP_LdArr<unsigned_char,int>(this,playout->SlotIndex,(uint)playout->Value);
    return;
  case TYPE_INT16:
    OP_LdArr<short,int>(this,playout->SlotIndex,(uint)playout->Value);
    return;
  case TYPE_UINT16:
    OP_LdArr<unsigned_short,int>(this,playout->SlotIndex,(uint)playout->Value);
    return;
  case TYPE_INT32:
    OP_LdArr<int,int>(this,playout->SlotIndex,(uint)playout->Value);
    return;
  case TYPE_UINT32:
    OP_LdArr<unsigned_int,int>(this,playout->SlotIndex,(uint)playout->Value);
    return;
  case TYPE_FLOAT32:
    OP_LdArr<float,float>(this,playout->SlotIndex,(uint)playout->Value);
    return;
  case TYPE_FLOAT64:
    OP_LdArr<double,double>(this,playout->SlotIndex,(uint)playout->Value);
    return;
  case TYPE_INT64:
    OP_LdArr<long,long>(this,playout->SlotIndex,(uint)playout->Value);
    return;
  case TYPE_INT8_TO_INT64:
    OP_LdArr<char,long>(this,playout->SlotIndex,(uint)playout->Value);
    return;
  case TYPE_UINT8_TO_INT64:
    OP_LdArr<unsigned_char,long>(this,playout->SlotIndex,(uint)playout->Value);
    return;
  case TYPE_INT16_TO_INT64:
    OP_LdArr<short,long>(this,playout->SlotIndex,(uint)playout->Value);
    return;
  case TYPE_UINT16_TO_INT64:
    OP_LdArr<unsigned_short,long>(this,playout->SlotIndex,(uint)playout->Value);
    return;
  case TYPE_INT32_TO_INT64:
    OP_LdArr<int,long>(this,playout->SlotIndex,(uint)playout->Value);
    return;
  case TYPE_UINT32_TO_INT64:
    OP_LdArr<unsigned_int,long>(this,playout->SlotIndex,(uint)playout->Value);
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                              ,0x2395,"((0))","UNREACHED");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdArrConstIndex(const unaligned T* playout)
    {
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: \
            OP_LdArr<MemType, RegType>(playout->SlotIndex, playout->Value); \
            return;
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
    }